

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::insert(QString *this,qsizetype i,QChar *unicode,qsizetype size)

{
  long lVar1;
  bool bVar2;
  long in_RCX;
  QString *in_RSI;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  QVarLengthArray<QChar,_256LL> copy;
  QVarLengthArray<QChar,_256LL> *in_stack_fffffffffffffd70;
  QStringView *in_stack_fffffffffffffd80;
  QVLABase<QChar> *this_00;
  QString *in_stack_fffffffffffffd98;
  QChar **in_stack_fffffffffffffda0;
  QArrayDataPointer<char16_t> *first;
  QVarLengthArray<QChar,_256LL> *in_stack_fffffffffffffdc0;
  QChar *in_stack_fffffffffffffdd0;
  QVLABase<QChar> local_220;
  QStringView *in_stack_fffffffffffffe00;
  qsizetype in_stack_fffffffffffffe08;
  QString *in_stack_fffffffffffffe10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((-1 < (long)in_RSI) && (0 < in_RCX)) {
    first = in_RDI;
    QArrayDataPointer<char16_t>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<char16_t>::needsDetach
                      ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffd70);
    if ((bVar2) ||
       (bVar2 = QtPrivate::q_points_into_range<QString,QChar_const*>
                          (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98), !bVar2)) {
      QStringView::QStringView<QChar,_true>
                (in_stack_fffffffffffffd80,(QChar *)in_RSI,(qsizetype)in_stack_fffffffffffffd70);
      insert_helper<QStringView>
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    }
    else {
      this_00 = &local_220;
      memset(this_00,0xaa,0x218);
      QVarLengthArray<QChar,_256LL>::QVarLengthArray<const_QChar_*,_true>
                (in_stack_fffffffffffffdc0,(QChar *)first,(QChar *)in_RSI);
      QVLABase<QChar>::data(this_00);
      insert(in_RSI,in_RCX,in_stack_fffffffffffffdd0,(qsizetype)in_stack_fffffffffffffda0);
      QVarLengthArray<QChar,_256LL>::~QVarLengthArray(in_stack_fffffffffffffd70);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)in_RDI;
}

Assistant:

QString& QString::insert(qsizetype i, const QChar *unicode, qsizetype size)
{
    if (i < 0 || size <= 0)
        return *this;

    // In case when data points into "this"
    if (!d->needsDetach() && QtPrivate::q_points_into_range(unicode, *this)) {
        QVarLengthArray copy(unicode, unicode + size);
        insert(i, copy.data(), size);
    } else {
        insert_helper(*this, i, QStringView(unicode, size));
    }

    return *this;
}